

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

void __thiscall neueda::cdr::cdr(cdr *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__cdr_00123da8;
  *(undefined4 *)(in_RDI + 1) = 0;
  std::
  map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
  ::map((map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
         *)0x1131c1);
  std::
  map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
  ::map((map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
         *)0x1131cf);
  return;
}

Assistant:

cdr::cdr () :
    mNextIndex (0)
{
}